

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netgroup.cpp
# Opt level: O2

uint32_t __thiscall NetGroupManager::GetMappedAS(NetGroupManager *this,CNetAddr *address)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  Network NVar4;
  uint32_t uVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  int8_t byte_i_1;
  long lVar9;
  size_type sVar10;
  size_type sVar11;
  int8_t byte_i;
  long lVar12;
  long in_FS_OFFSET;
  reference rVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> addr_bytes;
  vector<bool,_std::allocator<bool>_> ip_bits;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  NVar4 = CNetAddr::GetNetClass(address);
  uVar5 = 0;
  if ((0xfffffffd < NVar4 - NET_ONION) &&
     (uVar5 = 0,
     ((long)(this->m_asmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
     (long)(this->m_asmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 !=
     -(ulong)(this->m_asmap).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset)) {
    std::vector<bool,_std::allocator<bool>_>::vector(&ip_bits,0x80,(allocator_type *)&addr_bytes);
    bVar3 = CNetAddr::HasLinkedIPv4(address);
    if (bVar3) {
      sVar11 = 0;
      for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 1) {
        bVar1 = IPV4_IN_IPV6_PREFIX._M_elems[lVar12];
        sVar10 = sVar11;
        for (lVar9 = 8; lVar9 != 0; lVar9 = lVar9 + -1) {
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&ip_bits,sVar10);
          puVar6 = rVar13._M_p;
          if ((bVar1 >> ((int)lVar9 - 1U & 0x1f) & 1) == 0) {
            uVar7 = ~rVar13._M_mask & *puVar6;
          }
          else {
            uVar7 = rVar13._M_mask | *puVar6;
          }
          *puVar6 = uVar7;
          sVar10 = sVar10 + 1;
        }
        sVar11 = sVar11 + 8;
      }
      uVar5 = CNetAddr::GetLinkedIPv4(address);
      lVar12 = 0x20;
      uVar7 = 0;
      while (bVar3 = lVar12 != 0, lVar12 = lVar12 + -1, bVar3) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&ip_bits,uVar7 | 0x60);
        puVar6 = rVar13._M_p;
        if ((uVar5 << ((byte)uVar7 & 0x1f) & 0x80000000) == 0) {
          uVar8 = ~rVar13._M_mask & *puVar6;
        }
        else {
          uVar8 = rVar13._M_mask | *puVar6;
        }
        *puVar6 = uVar8;
        uVar7 = uVar7 + 1;
      }
    }
    else {
      if (address->m_net != NET_IPV6) {
        __assert_fail("address.IsIPv6()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netgroup.cpp"
                      ,0x65,"uint32_t NetGroupManager::GetMappedAS(const CNetAddr &) const");
      }
      CNetAddr::GetAddrBytes(&addr_bytes,address);
      sVar11 = 0;
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
        bVar1 = addr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start[lVar12];
        sVar10 = sVar11;
        for (lVar9 = 8; lVar9 != 0; lVar9 = lVar9 + -1) {
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&ip_bits,sVar10);
          puVar6 = rVar13._M_p;
          if ((bVar1 >> ((int)lVar9 - 1U & 0x1f) & 1) == 0) {
            uVar7 = ~rVar13._M_mask & *puVar6;
          }
          else {
            uVar7 = rVar13._M_mask | *puVar6;
          }
          *puVar6 = uVar7;
          sVar10 = sVar10 + 1;
        }
        sVar11 = sVar11 + 8;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&addr_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    uVar5 = Interpret(&this->m_asmap,&ip_bits);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&ip_bits.super__Bvector_base<std::allocator<bool>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t NetGroupManager::GetMappedAS(const CNetAddr& address) const
{
    uint32_t net_class = address.GetNetClass();
    if (m_asmap.size() == 0 || (net_class != NET_IPV4 && net_class != NET_IPV6)) {
        return 0; // Indicates not found, safe because AS0 is reserved per RFC7607.
    }
    std::vector<bool> ip_bits(128);
    if (address.HasLinkedIPv4()) {
        // For lookup, treat as if it was just an IPv4 address (IPV4_IN_IPV6_PREFIX + IPv4 bits)
        for (int8_t byte_i = 0; byte_i < 12; ++byte_i) {
            for (uint8_t bit_i = 0; bit_i < 8; ++bit_i) {
                ip_bits[byte_i * 8 + bit_i] = (IPV4_IN_IPV6_PREFIX[byte_i] >> (7 - bit_i)) & 1;
            }
        }
        uint32_t ipv4 = address.GetLinkedIPv4();
        for (int i = 0; i < 32; ++i) {
            ip_bits[96 + i] = (ipv4 >> (31 - i)) & 1;
        }
    } else {
        // Use all 128 bits of the IPv6 address otherwise
        assert(address.IsIPv6());
        auto addr_bytes = address.GetAddrBytes();
        for (int8_t byte_i = 0; byte_i < 16; ++byte_i) {
            uint8_t cur_byte = addr_bytes[byte_i];
            for (uint8_t bit_i = 0; bit_i < 8; ++bit_i) {
                ip_bits[byte_i * 8 + bit_i] = (cur_byte >> (7 - bit_i)) & 1;
            }
        }
    }
    uint32_t mapped_as = Interpret(m_asmap, ip_bits);
    return mapped_as;
}